

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loc_comp_tests.cc
# Opt level: O3

void lf::fe::test::
     CheckElementMatrixProvider<double,double,lf::fe::MassEdgeMatrixProvider<double,lf::fe::test::lf_fe_MassEdgeMatrixProvider_Test::TestBody()::__0,lf::base::PredicateTrue>,lf::fe::test::lf_fe_MassEdgeMatrixProvider_Test::TestBody()::__1&>
               (ScalarFESpace<double> *fes_test,ScalarFESpace<double> *fes_trial,
               MassEdgeMatrixProvider<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12),_lf::base::PredicateTrue>
               *emp,anon_class_24_3_4c06d6f7 *evaluator,dim_t codim)

{
  undefined1 *puVar1;
  AssertHelperData *pAVar2;
  pointer pcVar3;
  RefEl ref_el;
  logger *plVar4;
  element_type *peVar5;
  element_type *peVar6;
  gdof_idx_t i;
  gdof_idx_t j;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  anon_class_8_1_898ec2eb *paVar11;
  void *__ptr;
  long lVar12;
  MeshFunctionReturnType<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::fe::MeshFunctionFE<double,_double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12)>,_lf::fe::MeshFunctionFE<double,_double>_>_>
  MVar13;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  undefined8 args;
  Index __n;
  undefined1 auVar14 [8];
  MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  MVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long *plVar20;
  undefined4 extraout_var_03;
  shared_ptr<spdlog::logger> *psVar21;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  QuadRule *pQVar22;
  CoeffReturnType pdVar23;
  CoeffReturnType pdVar24;
  ostream *poVar25;
  Scalar *pSVar26;
  undefined4 extraout_var_06;
  Scalar *pSVar27;
  ulong uVar28;
  long lVar29;
  long extraout_RDX;
  ulong uVar30;
  long extraout_RDX_00;
  _Elt_pointer index;
  ulong col;
  _func_int *message;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_3;
  anon_class_24_3_4c06d6f7 *paVar31;
  double __tmp;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  span<const_long,_18446744073709551615UL> sVar42;
  size_type nrows_loc;
  size_type ncols_loc;
  Matrix<double,__1,_1,_0,__1,_1> coeff_test;
  Matrix<double,__1,_1,_0,__1,_1> coeff_trial;
  ElemMat elem_mat;
  shared_ptr<const_lf::mesh::Mesh> mesh;
  VectorXd determinants;
  QuadRule qr;
  Matrix<double,__1,__1,_0,__1,__1> system_matrix;
  COOMatrix<double> coo_matrix;
  span<const_long,_18446744073709551615UL> col_idx;
  span<const_long,_18446744073709551615UL> row_idx;
  Matrix<double,__1,__1,_0,__1,__1> rsf;
  stringstream ss;
  uint local_44c;
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  variable_if_dynamic<long,__1> vStack_420;
  shared_ptr<lf::mesh::Mesh> *local_418;
  uint local_40c;
  undefined1 local_408 [32];
  variable_if_dynamic<long,__1> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3e0;
  anon_class_8_1_898ec2eb local_3d8;
  element_type *local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3c8;
  element_type *local_3c0;
  element_type *peStack_3b8;
  variable_if_dynamic<long,__1> local_3b0;
  variable_if_dynamic<long,__1> vStack_3a8;
  size_t local_3a0;
  undefined1 local_390 [16];
  undefined1 local_380 [56];
  DenseStorage<double,__1,__1,_1,_0> local_348;
  DenseStorage<double,__1,__1,_1,_0> local_338;
  DenseStorage<double,__1,__1,_1,_0> local_328;
  _Map_pointer local_318;
  undefined1 local_308 [16];
  MassEdgeMatrixProvider<double,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12),_lf::base::PredicateTrue>
  *local_2f0;
  _Elt_pointer local_2e8;
  element_type *local_2e0;
  _Elt_pointer local_2d8;
  _Map_pointer local_2d0;
  _Map_pointer local_2c8;
  element_type *local_2c0;
  element_type *local_2b8;
  DenseStorage<double,__1,__1,_1,_0> local_2b0;
  _Map_pointer local_2a0 [2];
  Matrix<double,__1,__1,_0,__1,__1> local_290;
  anon_class_24_3_4c06d6f7 *local_278;
  undefined1 local_270 [24];
  _Elt_pointer pQStack_258;
  _Map_pointer local_250;
  undefined4 uStack_248;
  char *local_240;
  COOMatrix<double> local_238;
  span<const_long,_18446744073709551615UL> local_218;
  span<const_long,_18446744073709551615UL> local_208;
  Matrix<double,__1,__1,_0,__1,__1> local_1f8;
  undefined1 local_1e0 [8];
  MeshDataSet<std::variant<std::monostate,_lf::fe::FePoint<double>,_lf::fe::FeHierarchicSegment<double>,_lf::fe::FeHierarchicTria<double>,_lf::fe::FeHierarchicQuad<double>_>_>
  MStack_1d8;
  undefined1 local_1d0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  variable_if_dynamic<long,__1> avStack_1b8 [11];
  ios_base local_160 [264];
  long *local_58;
  QuadRuleCache *local_50;
  long *local_48;
  long *local_40;
  scalar_constant_op<double> local_38;
  undefined4 extraout_var_02;
  
  local_2f0 = emp;
  iVar16 = (*fes_test->_vptr_ScalarFESpace[1])();
  uVar17 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar16) + 0x10))
                     ((long *)CONCAT44(extraout_var,iVar16));
  local_348.m_data = (double *)0x0;
  local_348.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_380 + 0x38),
             (ulong)uVar17);
  iVar16 = (*fes_trial->_vptr_ScalarFESpace[1])(fes_trial);
  uVar17 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar16) + 0x10))
                     ((long *)CONCAT44(extraout_var_00,iVar16));
  local_338.m_data = (double *)0x0;
  local_338.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_338,(ulong)uVar17);
  local_408._0_8_ = (pointer)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_1e0,local_348.m_rows,1,(scalar_constant_op<double> *)local_408);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)(local_380 + 0x38),
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_1e0,(assign_op<double,_double> *)local_408);
  auVar34 = _DAT_00446080;
  auVar36 = _DAT_00446070;
  if (0 < local_348.m_rows) {
    uVar28 = local_348.m_rows + 0x1fffffffffffffffU & 0x1fffffffffffffff;
    auVar32._8_4_ = (int)uVar28;
    auVar32._0_8_ = uVar28;
    auVar32._12_4_ = (int)(uVar28 >> 0x20);
    lVar29 = 0;
    auVar32 = auVar32 ^ _DAT_00446080;
    do {
      auVar40._8_4_ = (int)lVar29;
      auVar40._0_8_ = lVar29;
      auVar40._12_4_ = (int)((ulong)lVar29 >> 0x20);
      auVar40 = (auVar40 | auVar36) ^ auVar34;
      if ((bool)(~(auVar40._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar40._0_4_ ||
                  auVar32._4_4_ < auVar40._4_4_) & 1)) {
        *(undefined8 *)((RefEl *)local_348.m_data + lVar29 * 8) = local_1d0._0_8_;
      }
      if ((auVar40._12_4_ != auVar32._12_4_ || auVar40._8_4_ <= auVar32._8_4_) &&
          auVar40._12_4_ <= auVar32._12_4_) {
        (&(((MatrixXd *)((long)local_348.m_data + 8))->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data)
        [lVar29] = (double *)local_1d0._0_8_;
      }
      lVar29 = lVar29 + 2;
    } while ((uVar28 - ((uint)(local_348.m_rows + 0x1fffffffffffffffU) & 1)) + 2 != lVar29);
  }
  local_408._0_8_ = (long *)0x0;
  Eigen::
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
  ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *)local_1e0,local_338.m_rows,1,(scalar_constant_op<double> *)local_408);
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>,double,double>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_338,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
              *)local_1e0,(assign_op<double,_double> *)local_408);
  auVar34 = _DAT_00446080;
  auVar36 = _DAT_00446070;
  if (0 < local_338.m_rows) {
    puVar1 = (undefined1 *)
             ((long)&(((_Elt_pointer)(local_338.m_rows + 0x1fffffffffffffe0))->points_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols + 7);
    uVar28 = (ulong)puVar1 & 0x1fffffffffffffff;
    auVar33._8_4_ = (int)uVar28;
    auVar33._0_8_ = uVar28;
    auVar33._12_4_ = (int)(uVar28 >> 0x20);
    lVar29 = 0;
    auVar33 = auVar33 ^ _DAT_00446080;
    do {
      auVar41._8_4_ = (int)lVar29;
      auVar41._0_8_ = lVar29;
      auVar41._12_4_ = (int)((ulong)lVar29 >> 0x20);
      auVar32 = (auVar41 | auVar36) ^ auVar34;
      if ((bool)(~(auVar32._4_4_ == auVar33._4_4_ && auVar33._0_4_ < auVar32._0_4_ ||
                  auVar33._4_4_ < auVar32._4_4_) & 1)) {
        *(undefined8 *)((RefEl *)local_338.m_data + lVar29 * 8) = local_1d0._0_8_;
      }
      if ((auVar32._12_4_ != auVar33._12_4_ || auVar32._8_4_ <= auVar33._8_4_) &&
          auVar32._12_4_ <= auVar33._12_4_) {
        (&(((MatrixXd *)((long)local_338.m_data + 8))->
          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data)
        [lVar29] = (double *)local_1d0._0_8_;
      }
      lVar29 = lVar29 + 2;
    } while ((uVar28 - ((uint)puVar1 & 1)) + 2 != lVar29);
  }
  local_238.rows_ = (size_type)local_348.m_rows;
  local_238.cols_ = (size_type)local_338.m_rows;
  local_238.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.triplets_.
  super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar16 = (*fes_trial->_vptr_ScalarFESpace[1])(fes_trial);
  local_2e8 = (_Elt_pointer)CONCAT44(extraout_var_01,iVar16);
  iVar16 = (*fes_test->_vptr_ScalarFESpace[1])(fes_test);
  plVar20 = (long *)CONCAT44(extraout_var_02,iVar16);
  (**(code **)(*(long *)local_2e8 + 0x40))(&local_2e0);
  local_48 = plVar20;
  (**(code **)(*plVar20 + 0x40))(local_1e0,plVar20);
  auVar14 = local_1e0;
  peVar7 = local_2e0;
  if ((element_type *)MStack_1d8._vptr_MeshDataSet != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)MStack_1d8._vptr_MeshDataSet);
  }
  local_278 = evaluator;
  if ((undefined1  [8])peVar7 != auVar14) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,"Trial and test space must be defined on the same mesh",0x35);
    pcVar3 = local_408 + 0x10;
    local_408._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_408,"mesh == dof_handler_test.Mesh()","");
    pAVar2 = (AssertHelperData *)(local_448 + 0x10);
    local_448._0_8_ = pAVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
               ,"");
    std::__cxx11::stringbuf::str();
    base::AssertionFailed((string *)local_408,(string *)local_448,0x7a,(string *)local_390);
    if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
      operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
    }
    if ((AssertHelperData *)local_448._0_8_ != pAVar2) {
      operator_delete((void *)local_448._0_8_,(ulong)(local_438._0_8_ + 1));
    }
    if ((pointer)local_408._0_8_ != pcVar3) {
      operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
    }
    local_408._16_6_ = 0x65736c6166;
    local_408._8_8_ = 5;
    local_448._0_8_ = pAVar2;
    local_408._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_448,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
               ,"");
    local_390._8_8_ = 0;
    local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
    local_390._0_8_ = (element_type *)local_380;
    base::AssertionFailed((string *)local_408,(string *)local_448,0x7a,(string *)local_390);
LAB_001871d0:
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)local_448);
    std::__cxx11::string::~string((string *)local_408);
    abort();
  }
  iVar16 = (*(local_2e0->super_ScalarFESpace<double>)._vptr_ScalarFESpace[2])(local_2e0,1);
  plVar20 = (long *)CONCAT44(extraout_var_03,iVar16);
  if (extraout_RDX != 0) {
    local_58 = plVar20 + extraout_RDX;
    local_50 = &local_2f0->qr_cache_;
    do {
      local_380._40_8_ = *plVar20;
      iVar16 = (*(*(_func_int ***)&((_Elt_pointer)local_380._40_8_)->ref_el_)[4])();
      if ((char)iVar16 != '\x02') {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"Wrong type for an edge",0x16);
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"edge.RefEl() == lf::base::RefEl::kSegment()","");
        pAVar2 = (AssertHelperData *)(local_448 + 0x10);
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/loc_comp_ellbvp.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_408,(string *)local_448,0x1c4,(string *)local_390);
        if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
          operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
        }
        if ((AssertHelperData *)local_448._0_8_ != pAVar2) {
          operator_delete((void *)local_448._0_8_,(ulong)(local_438._0_8_ + 1));
        }
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        local_408._0_8_ = local_408 + 0x10;
        local_408._16_6_ = 0x65736c6166;
        local_408._8_8_ = 5;
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/loc_comp_ellbvp.h"
                   ,"");
        local_390._8_8_ = 0;
        local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
        local_390._0_8_ = (element_type *)local_380;
        base::AssertionFailed((string *)local_408,(string *)local_448,0x1c4,(string *)local_390);
        goto LAB_001871d0;
      }
      psVar21 = assemble::AssembleMatrixLogger();
      args = local_380._40_8_;
      plVar4 = (psVar21->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_40 = plVar20;
      iVar16 = (*(local_2e0->super_ScalarFESpace<double>)._vptr_ScalarFESpace[5])
                         (local_2e0,local_380._40_8_);
      local_408._0_4_ = iVar16;
      local_1e0 = (undefined1  [8])0x44d1d4;
      MStack_1d8._vptr_MeshDataSet._0_4_ = 0x82;
      local_1d0._0_8_ = "AssembleMatrixLocally";
      loc._8_8_ = MStack_1d8._vptr_MeshDataSet;
      loc.filename = 
      "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
      ;
      loc.funcname = "AssembleMatrixLocally";
      fmt.size_ = 0xe;
      fmt.data_ = "Entity {} ({})";
      spdlog::logger::log_<lf::mesh::Entity_const&,unsigned_int>
                (plVar4,loc,debug,fmt,(Entity *)args,(uint *)local_408);
      plVar20 = local_48;
      local_44c = (**(code **)(*local_48 + 0x18))(local_48,args);
      local_40c = (**(code **)(*(long *)local_2e8 + 0x18))(local_2e8,args);
      sVar42 = (span<const_long,_18446744073709551615UL>)
               (**(code **)(*plVar20 + 0x28))(plVar20,args);
      local_208 = sVar42;
      sVar42 = (span<const_long,_18446744073709551615UL>)
               (**(code **)(*(long *)local_2e8 + 0x28))(local_2e8,args);
      local_218 = sVar42;
      iVar16 = (*(*(_func_int ***)args)[3])(args);
      auVar36 = local_308;
      local_308._4_4_ = extraout_var_04;
      local_308._0_4_ = iVar16;
      local_308._8_8_ = auVar36._8_8_;
      peVar5 = (local_2f0->fe_space_).
               super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar16 = (*peVar5->_vptr_ScalarFESpace[2])(peVar5,local_380._40_8_);
      plVar20 = (long *)CONCAT44(extraout_var_05,iVar16);
      iVar16 = (*(*(_func_int ***)local_380._40_8_)[4])();
      iVar18 = (**(code **)(*plVar20 + 0x18))(plVar20);
      pQVar22 = quad::QuadRuleCache::Get(local_50,(RefEl)(RefElType)iVar16,iVar18 * 2);
      quad::QuadRule::QuadRule((QuadRule *)&local_2c0,pQVar22);
      (**(code **)(*(long *)local_308._0_8_ + 0x30))(&local_2d0,local_308._0_8_,&local_2b8);
      if (local_2c8 != (_Map_pointer)(local_2b0.m_rows & 0xffffffffU)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"Mismatch ",9);
        poVar25 = std::ostream::_M_insert<long>((long)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25," <-> ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"determinants.size() == qr.NumPoints()","");
        pAVar2 = (AssertHelperData *)(local_448 + 0x10);
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/loc_comp_ellbvp.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_408,(string *)local_448,0x202,(string *)local_390);
        if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
          operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
        }
        if ((AssertHelperData *)local_448._0_8_ != pAVar2) {
          operator_delete((void *)local_448._0_8_,(ulong)(local_438._0_8_ + 1));
        }
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        local_408._0_8_ = local_408 + 0x10;
        local_408._16_6_ = 0x65736c6166;
        local_408._8_8_ = 5;
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/loc_comp_ellbvp.h"
                   ,"");
        local_390._8_8_ = 0;
        local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
        local_390._0_8_ = (element_type *)local_380;
        base::AssertionFailed((string *)local_408,(string *)local_448,0x202,(string *)local_390);
        goto LAB_001871d0;
      }
      uVar17 = (**(code **)(*plVar20 + 0x20))(plVar20);
      uVar19 = (**(code **)(*plVar20 + 0x20))(plVar20);
      local_328.m_data = (double *)0x0;
      local_328.m_rows = 0;
      local_318 = (_Map_pointer)0x0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_328,
                 (ulong)uVar17,(ulong)uVar19);
      local_408._0_8_ = (long *)0x0;
      Eigen::
      CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
      ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_1e0,local_328.m_rows,(Index)local_318,
                       (scalar_constant_op<double> *)local_408);
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_328,
                 (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_1e0,(assign_op<double,_double> *)local_408);
      __n = local_2b0.m_rows;
      if (0 < local_328.m_rows * (long)local_318) {
        uVar28 = local_328.m_rows * (long)local_318 * 8 - 8;
        auVar36._8_4_ = (int)uVar28;
        auVar36._0_8_ = uVar28;
        auVar36._12_4_ = (int)(uVar28 >> 0x20);
        auVar34._0_8_ = uVar28 >> 3;
        auVar34._8_8_ = auVar36._8_8_ >> 3;
        auVar34 = auVar34 ^ _DAT_00446080;
        uVar30 = 0;
        do {
          auVar35._8_4_ = (int)uVar30;
          auVar35._0_8_ = uVar30;
          auVar35._12_4_ = (int)(uVar30 >> 0x20);
          auVar36 = (auVar35 | _DAT_00446070) ^ _DAT_00446080;
          auVar38._0_4_ = -(uint)(auVar34._0_4_ < auVar36._0_4_);
          auVar38._4_4_ = -(uint)(auVar34._4_4_ < auVar36._4_4_);
          auVar38._8_4_ = -(uint)(auVar34._8_4_ < auVar36._8_4_);
          auVar38._12_4_ = -(uint)(auVar34._12_4_ < auVar36._12_4_);
          iVar16 = -(uint)(auVar36._4_4_ == auVar34._4_4_);
          iVar18 = -(uint)(auVar36._12_4_ == auVar34._12_4_);
          auVar39._4_4_ = iVar16;
          auVar39._0_4_ = iVar16;
          auVar39._8_4_ = iVar18;
          auVar39._12_4_ = iVar18;
          auVar37._4_4_ = auVar38._4_4_;
          auVar37._0_4_ = auVar38._4_4_;
          auVar37._8_4_ = auVar38._12_4_;
          auVar37._12_4_ = auVar38._12_4_;
          auVar37 = auVar37 | auVar39 & auVar38;
          if ((~auVar37._0_4_ & 1) != 0) {
            *(undefined8 *)((RefEl *)local_328.m_data + uVar30 * 8) = local_1d0._0_8_;
          }
          if (((auVar37 ^ _DAT_004460b0) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            (&(((MatrixXd *)((long)local_328.m_data + 8))->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data)
            [uVar30] = (double *)local_1d0._0_8_;
          }
          uVar30 = uVar30 + 2;
        } while (((uVar28 >> 3) + 2 & 0xfffffffffffffffe) != uVar30);
      }
      peVar6 = (((local_2f0->gamma_).mesh)->
               super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar17 = (*peVar6->_vptr_Mesh[5])(peVar6,local_380._40_8_);
      local_1e0 = (undefined1  [8])((double)uVar17 + 10.0);
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_290,__n,
                 (value_type_conflict4 *)local_1e0,(allocator_type *)local_408);
      (**(code **)(*plVar20 + 0x38))(&local_1f8,plVar20,&local_2b8);
      if (0 < (long)local_2c8) {
        lVar29 = 0;
        do {
          pdVar23 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                               local_2a0,lVar29);
          local_308._0_8_ = (_Elt_pointer)*pdVar23;
          pdVar23 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                               &local_2d0,lVar29);
          local_308._0_8_ =
               (double)local_308._0_8_ * *pdVar23 *
               *(double *)
                ((RefEl *)local_290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          .m_storage.m_data + lVar29 * 8);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_448
                     ,&local_1f8,lVar29);
          Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                    ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_390
                     ,&local_1f8,lVar29);
          local_3a0 = local_380._32_8_;
          local_3b0.m_value = local_380._16_8_;
          vStack_3a8.m_value = local_380._24_8_;
          local_3c0 = (element_type *)local_380._0_8_;
          peStack_3b8 = (element_type *)local_380._8_8_;
          local_3d0 = (element_type *)local_390._0_8_;
          _Stack_3c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_390._8_8_;
          local_408._0_8_ = local_448._0_8_;
          local_408._8_8_ = local_448._8_8_;
          local_408._16_8_ = local_438._0_8_;
          local_408._24_8_ = local_438._8_8_;
          local_3d8.mesh = local_418;
          local_38.m_other = (double)local_308._0_8_;
          Eigen::
          CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
          ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                            *)local_270,local_448._8_8_,local_390._8_8_,&local_38);
          Eigen::
          CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)local_1e0,(Lhs *)local_408,
                          (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                           *)local_270,(scalar_product_op<double,_double> *)(local_380 + 0x37));
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>const>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>,Eigen::internal::add_assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)&local_328,
                     (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)local_1e0,(add_assign_op<double,_double> *)local_270);
          lVar29 = lVar29 + 1;
        } while (lVar29 < (long)local_2c8);
      }
      free(local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      if ((_Elt_pointer)
          local_290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data != (_Elt_pointer)0x0) {
        operator_delete(local_290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_data,
                        local_290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_cols -
                        (long)local_290.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data);
      }
      free(local_2d0);
      free(local_2a0[0]);
      free(local_2b8);
      if (local_328.m_rows < (long)(ulong)local_44c) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"nrows mismatch ",0xf);
        poVar25 = std::ostream::_M_insert<long>((long)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25," <-> ",5);
        poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25,", entity ",9);
        (*(local_2e0->super_ScalarFESpace<double>)._vptr_ScalarFESpace[5])
                  (local_2e0,local_380._40_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"elem_mat.rows() >= nrows_loc","");
        pAVar2 = (AssertHelperData *)(local_448 + 0x10);
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_408,(string *)local_448,0x91,(string *)local_390);
        if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
          operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
        }
        if ((AssertHelperData *)local_448._0_8_ != pAVar2) {
          operator_delete((void *)local_448._0_8_,(ulong)(local_438._0_8_ + 1));
        }
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        local_408._0_8_ = local_408 + 0x10;
        local_408._16_6_ = 0x65736c6166;
        local_408._8_8_ = 5;
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                   ,"");
        local_390._8_8_ = 0;
        local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
        local_390._0_8_ = (element_type *)local_380;
        base::AssertionFailed((string *)local_408,(string *)local_448,0x91,(string *)local_390);
        goto LAB_001871d0;
      }
      if ((long)local_318 < (long)(ulong)local_40c) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1d0,"ncols mismatch ",0xf);
        poVar25 = std::ostream::_M_insert<long>((long)local_1d0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25," <-> ",5);
        poVar25 = std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar25,", entity ",9);
        (*(local_2e0->super_ScalarFESpace<double>)._vptr_ScalarFESpace[5])
                  (local_2e0,local_380._40_8_);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar25);
        local_408._0_8_ = local_408 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_408,"elem_mat.cols() >= ncols_loc","");
        pAVar2 = (AssertHelperData *)(local_448 + 0x10);
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                   ,"");
        std::__cxx11::stringbuf::str();
        base::AssertionFailed((string *)local_408,(string *)local_448,0x94,(string *)local_390);
        if ((element_type *)local_390._0_8_ != (element_type *)local_380) {
          operator_delete((void *)local_390._0_8_,(ulong)(local_380._0_8_ + 1));
        }
        if ((AssertHelperData *)local_448._0_8_ != pAVar2) {
          operator_delete((void *)local_448._0_8_,(ulong)(local_438._0_8_ + 1));
        }
        if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
          operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
        }
        local_408._0_8_ = local_408 + 0x10;
        local_408._16_6_ = 0x65736c6166;
        local_408._8_8_ = 5;
        local_448._0_8_ = pAVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_448,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
                   ,"");
        local_390._8_8_ = 0;
        local_380._0_8_ = local_380._0_8_ & 0xffffffffffffff00;
        local_390._0_8_ = (element_type *)local_380;
        base::AssertionFailed((string *)local_408,(string *)local_448,0x94,(string *)local_390);
        goto LAB_001871d0;
      }
      psVar21 = assemble::AssembleMatrixLogger();
      local_1e0 = (undefined1  [8])0x44d1d4;
      MStack_1d8._vptr_MeshDataSet._0_4_ = 0x98;
      local_1d0._0_8_ = "AssembleMatrixLocally";
      loc_00._8_8_ = MStack_1d8._vptr_MeshDataSet;
      loc_00.filename =
           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
      ;
      loc_00.funcname = "AssembleMatrixLocally";
      fmt_00.size_ = 0x1a;
      fmt_00.data_ = "row_idx = {}, col_idx = {}";
      spdlog::logger::
      log_<std::span<long_const,18446744073709551615ul>&,std::span<long_const,18446744073709551615ul>&>
                ((psVar21->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 loc_00,debug,fmt_00,&local_208,&local_218);
      psVar21 = assemble::AssembleMatrixLogger();
      local_1e0 = (undefined1  [8])0x44d1d4;
      MStack_1d8._vptr_MeshDataSet._0_4_ = 0x9c;
      local_1d0._0_8_ = "AssembleMatrixLocally";
      loc_01._8_8_ = MStack_1d8._vptr_MeshDataSet;
      loc_01.filename =
           "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/assemble/assembler.h"
      ;
      loc_01.funcname = "AssembleMatrixLocally";
      fmt_01.size_ = 0x16;
      fmt_01.data_ = "{} x {} element matrix";
      spdlog::logger::log_<unsigned_int_const&,unsigned_int_const&>
                ((psVar21->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                 loc_01,debug,fmt_01,&local_44c,&local_40c);
      std::__cxx11::stringstream::stringstream((stringstream *)local_1e0);
      if (local_44c != 0) {
        uVar28 = (ulong)local_40c;
        uVar30 = 0;
        uVar17 = local_44c;
        do {
          if ((int)uVar28 == 0) {
            uVar28 = 0;
          }
          else {
            col = 0;
            do {
              i = *(gdof_idx_t *)((RefEl *)local_208._M_ptr + uVar30 * 8);
              j = *(gdof_idx_t *)((RefEl *)local_218._M_ptr + col * 8);
              pdVar24 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                        operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *)
                                   &local_328,uVar30,col);
              assemble::COOMatrix<double>::AddToEntry(&local_238,i,j,*pdVar24);
              psVar21 = assemble::AssembleMatrixLogger();
              if ((((psVar21->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   )->level_).super___atomic_base<int>._M_i < 1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"(",1);
                poVar25 = std::ostream::_M_insert<long>((long)local_1d0);
                local_408[0] = 0x2c;
                poVar25 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar25,(char *)local_408,1);
                poVar25 = std::ostream::_M_insert<long>((long)poVar25);
                std::__ostream_insert<char,std::char_traits<char>>(poVar25,")+= ",4);
                pdVar24 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *
                                     )&local_328,uVar30,col);
                poVar25 = std::ostream::_M_insert<double>(*pdVar24);
                std::__ostream_insert<char,std::char_traits<char>>(poVar25,", ",2);
              }
              col = col + 1;
              uVar28 = (ulong)local_40c;
              uVar17 = local_44c;
            } while (col < uVar28);
          }
          uVar30 = uVar30 + 1;
        } while (uVar30 < uVar17);
      }
      psVar21 = assemble::AssembleMatrixLogger();
      plVar4 = (psVar21->super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_250 = (_Map_pointer)0x44d1d4;
      uStack_248 = 0xb6;
      local_240 = "AssembleMatrixLocally";
      std::__cxx11::stringbuf::str();
      spdlog::logger::log(plVar4,(double)local_250);
      plVar20 = local_40;
      if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
        operator_delete((void *)local_408._0_8_,(ulong)(local_408._16_8_ + 1));
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1e0);
      std::ios_base::~ios_base(local_160);
      free(local_328.m_data);
      plVar20 = plVar20 + 1;
    } while (plVar20 != local_58);
  }
  if (local_2d8 != (_Elt_pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8);
  }
  assemble::COOMatrix<double>::makeDense(&local_290,&local_238);
  if (0 < local_348.m_rows) {
    index = (_Elt_pointer)0x0;
    paVar31 = local_278;
    do {
      pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           (local_380 + 0x38),(Index)index);
      *pSVar26 = 1.0;
      if (0 < local_338.m_rows) {
        uVar28 = 0;
        local_380._40_8_ = index;
        do {
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &local_338,uVar28);
          *pSVar26 = 1.0;
          peVar7 = (paVar31->fes->
                   super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          peVar8 = (element_type *)
                   (paVar31->fes->
                   super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_refcount._M_pi;
          if (peVar8 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(peVar8->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(peVar8->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(peVar8->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(peVar8->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
            }
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)&local_1f8,
                     (DenseStorage<double,__1,__1,_1,_0> *)(local_380 + 0x38));
          local_2b0.m_data =
               local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data;
          local_2b0.m_rows =
               local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_rows;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data = (double *)0x0;
          local_1f8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows = 0;
          peVar9 = (paVar31->fes->
                   super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          peVar10 = (element_type *)
                    (paVar31->fes->
                    super___shared_ptr<lf::fe::HierarchicScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount._M_pi;
          if (peVar10 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(peVar10->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(peVar10->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(peVar10->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(peVar10->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
            }
          }
          local_2c0 = peVar7;
          local_2b8 = peVar8;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_328,&local_338);
          local_270._16_8_ = local_328.m_data;
          pQStack_258 = (_Elt_pointer)local_328.m_rows;
          local_328.m_data = (double *)0x0;
          local_328.m_rows = 0;
          peVar6 = (paVar31->mesh->super___shared_ptr<lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          paVar11 = paVar31->g;
          local_1e0 = (undefined1  [8])local_2c0;
          MStack_1d8._vptr_MeshDataSet = (_func_int **)local_2b8;
          if (local_2b8 != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(local_2b8->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(local_2b8->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(local_2b8->mesh_p_).
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   *(int *)&(local_2b8->mesh_p_).
                            super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 1;
            }
          }
          local_270._0_8_ = peVar9;
          local_270._8_8_ = peVar10;
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)local_1d0,&local_2b0);
          MVar15._vptr_MeshDataSet = MStack_1d8._vptr_MeshDataSet;
          local_380._24_8_ = paVar11->mesh;
          local_390._8_8_ = local_1e0;
          local_380._0_8_ = MStack_1d8._vptr_MeshDataSet;
          local_380._8_8_ = local_1d0._0_8_;
          local_380._16_8_ = local_1d0._8_8_;
          MStack_1d8._vptr_MeshDataSet = (_func_int **)local_1e0;
          local_1d0._0_8_ = MVar15._vptr_MeshDataSet;
          if ((element_type *)MVar15._vptr_MeshDataSet != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(MVar15._vptr_MeshDataSet + 1))->
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   = *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(MVar15._vptr_MeshDataSet + 1))
                              ->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(MVar15._vptr_MeshDataSet + 1))->
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   = *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(MVar15._vptr_MeshDataSet + 1))
                              ->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr + 1;
            }
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)(local_1d0 + 8),
                     (DenseStorage<double,__1,__1,_1,_0> *)(local_380 + 8));
          avStack_1b8[0].m_value = local_380._24_8_;
          local_448._0_8_ = local_270._0_8_;
          local_448._8_8_ = local_270._8_8_;
          if ((element_type *)local_270._8_8_ != (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(local_270._8_8_ + 8))->
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   = *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(local_270._8_8_ + 8))->
                              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + 1;
              UNLOCK();
            }
            else {
              *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(local_270._8_8_ + 8))->
                       super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   = *(int *)&(((shared_ptr<const_lf::mesh::Mesh> *)(local_270._8_8_ + 8))->
                              super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr + 1;
            }
          }
          Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                    ((DenseStorage<double,__1,__1,_1,_0> *)(local_448 + 0x10),
                     (DenseStorage<double,__1,__1,_1,_0> *)(local_270 + 0x10));
          local_408._16_8_ = MStack_1d8._vptr_MeshDataSet;
          local_408._24_8_ = local_1d0._0_8_;
          _Stack_3e0._M_pi = local_1c0._M_pi;
          local_3e8.m_value = local_1d0._8_8_;
          local_3d8.mesh = (shared_ptr<lf::mesh::Mesh> *)avStack_1b8[0].m_value;
          local_3d0 = (element_type *)local_448._0_8_;
          _Stack_3c8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_448._8_8_;
          local_3c0 = (element_type *)local_438._0_8_;
          peStack_3b8 = (element_type *)local_438._8_8_;
          lVar29 = 0;
          do {
            quad::QuadRule::QuadRule((QuadRule *)(local_1e0 + lVar29));
            lVar29 = lVar29 + 0x30;
          } while (lVar29 != 0xf0);
          local_250 = (_Map_pointer)CONCAT53(local_250._3_5_,0x40302);
          lVar29 = 0;
          do {
            ref_el.type_ = *(RefElType *)((long)&local_250 + lVar29);
            quad::make_QuadRule((QuadRule *)local_448,ref_el,2);
            uVar30 = (ulong)((uint)ref_el.type_ * 0x30);
            local_1e0[uVar30] = local_448[0];
            *(undefined4 *)(local_1e0 + uVar30 + 4) = local_448._4_4_;
            peVar7 = *(element_type **)((long)&MStack_1d8._vptr_MeshDataSet + uVar30);
            *(undefined8 *)((long)&MStack_1d8._vptr_MeshDataSet + uVar30) = local_448._8_8_;
            peVar8 = *(element_type **)(local_1d0 + uVar30);
            peVar9 = *(element_type **)(local_1d0 + uVar30 + 8);
            *(undefined8 *)(local_1d0 + uVar30) = local_438._0_8_;
            *(undefined8 *)(local_1d0 + uVar30 + 8) = local_438._8_8_;
            __ptr = *(void **)((long)&local_1c0._M_pi + uVar30);
            lVar12 = *(long *)((long)&avStack_1b8[0].m_value + uVar30);
            *(undefined8 *)((long)&local_1c0._M_pi + uVar30) = local_438._16_8_;
            *(long *)((long)&avStack_1b8[0].m_value + uVar30) = vStack_420.m_value;
            local_448._8_8_ = peVar7;
            local_438._0_8_ = peVar8;
            local_438._8_8_ = peVar9;
            local_438._16_8_ = __ptr;
            vStack_420.m_value = lVar12;
            free(__ptr);
            free((void *)local_448._8_8_);
            lVar29 = lVar29 + 1;
          } while (lVar29 != 3);
          iVar16 = (*peVar6->_vptr_Mesh[2])(peVar6,1);
          MVar13 = internal::
                   LocalIntegral<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::fe::MeshFunctionFE<double,_double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12)>,_lf::fe::MeshFunctionFE<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_fe_tools_h:165:17)>
                             (*(Entity **)CONCAT44(extraout_var_06,iVar16),
                              (anon_class_8_1_ba1d71d2 *)local_1e0,
                              (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::fe::MeshFunctionFE<double,_double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12)>,_lf::fe::MeshFunctionFE<double,_double>_>
                               *)local_408);
          local_308._8_4_ = extraout_XMM0_Dc;
          local_308._0_8_ = MVar13;
          local_308._12_4_ = extraout_XMM0_Dd;
          if (extraout_RDX_00 != 1) {
            lVar29 = 8;
            do {
              MVar13 = internal::
                       LocalIntegral<lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::fe::MeshFunctionFE<double,_double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12)>,_lf::fe::MeshFunctionFE<double,_double>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_fe_tools_h:165:17)>
                                 (*(Entity **)((long)CONCAT44(extraout_var_06,iVar16) + lVar29),
                                  (anon_class_8_1_ba1d71d2 *)local_1e0,
                                  (MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::mesh::utils::MeshFunctionBinary<lf::mesh::utils::internal::OperatorMultiplication,_lf::fe::MeshFunctionFE<double,_double>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_test_loc_comp_tests_cc:381:12)>,_lf::fe::MeshFunctionFE<double,_double>_>
                                   *)local_408);
              local_308._0_8_ = (double)local_308._0_8_ + MVar13;
              lVar29 = lVar29 + 8;
            } while (extraout_RDX_00 << 3 != lVar29);
          }
          lVar29 = 0xf0;
          do {
            free(*(void **)(local_1e0 + lVar29 + -0x10));
            free(*(void **)((long)&local_208._M_ptr + lVar29));
            lVar29 = lVar29 + -0x30;
          } while (lVar29 != 0);
          free(local_3c0);
          paVar31 = local_278;
          if ((element_type *)_Stack_3c8._M_pi != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_3c8._M_pi);
          }
          free((void *)local_3e8.m_value);
          index = (_Elt_pointer)local_380._40_8_;
          if ((element_type *)local_408._24_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._24_8_);
          }
          free((void *)local_380._8_8_);
          if ((element_type *)local_380._0_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_380._0_8_);
          }
          free((void *)local_270._16_8_);
          if ((element_type *)local_270._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_270._8_8_);
          }
          free(local_2b0.m_data);
          if (local_2b8 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8);
          }
          Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                    ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)&local_290,
                     (Index)index,uVar28);
          pSVar27 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                               &local_290,(Index)index,uVar28);
          local_408._0_8_ = ABS((double)local_308._0_8_ - *pSVar27);
          local_448._0_8_ = &DAT_3e7ad7f29abcaf48;
          testing::internal::CmpHelperLT<double,double>
                    ((internal *)local_1e0,"std::abs(result - system_matrix(i, j))","1e-7",
                     (double *)local_408,(double *)local_448);
          if (local_1e0[0] == (stringstream)0x0) {
            testing::Message::Message((Message *)local_408);
            if ((element_type *)MStack_1d8._vptr_MeshDataSet == (element_type *)0x0) {
              message = (_func_int *)0x46ad26;
            }
            else {
              message = *MStack_1d8._vptr_MeshDataSet;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)local_448,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/fe/test/loc_comp_tests.cc"
                       ,0xea,(char *)message);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)local_448,(Message *)local_408);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_448);
            if ((long *)local_408._0_8_ != (long *)0x0) {
              (**(code **)(*(long *)local_408._0_8_ + 8))();
            }
            if ((element_type *)MStack_1d8._vptr_MeshDataSet != (element_type *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&MStack_1d8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           MStack_1d8._vptr_MeshDataSet);
            }
            goto LAB_00187026;
          }
          if ((element_type *)MStack_1d8._vptr_MeshDataSet != (element_type *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&MStack_1d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         MStack_1d8._vptr_MeshDataSet);
          }
          pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                               &local_338,uVar28);
          *pSVar26 = 0.0;
          uVar28 = (ulong)((int)uVar28 + 1);
        } while ((long)uVar28 < local_338.m_rows);
      }
      pSVar26 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                           (local_380 + 0x38),(Index)index);
      *pSVar26 = 0.0;
      index = (_Elt_pointer)(ulong)((int)index + 1);
    } while ((long)index < local_348.m_rows);
  }
LAB_00187026:
  free(local_290.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  if (local_238.triplets_.
      super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.triplets_.
                    super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.triplets_.
                          super__Vector_base<Eigen::Triplet<double,_int>,_std::allocator<Eigen::Triplet<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  free(local_338.m_data);
  free(local_348.m_data);
  return;
}

Assistant:

void CheckElementMatrixProvider(const ScalarFESpace<SCALAR_TEST> &fes_test,
                                const ScalarFESpace<SCALAR_TRIAL> &fes_trial,
                                const EMP &emp, EVALUATOR &&evaluator,
                                base::dim_t codim = 0) {
  Eigen::Matrix<SCALAR_TEST, Eigen::Dynamic, 1> coeff_test(
      fes_test.LocGlobMap().NumDofs());
  Eigen::Matrix<SCALAR_TRIAL, Eigen::Dynamic, 1> coeff_trial(
      fes_trial.LocGlobMap().NumDofs());
  coeff_test.setZero();
  coeff_trial.setZero();

  using scalar_matrix_t = decltype(evaluator(coeff_test, coeff_trial));

  // assemble the matrix:
  assemble::COOMatrix<scalar_matrix_t> coo_matrix(coeff_test.rows(),
                                                  coeff_trial.rows());
  assemble::AssembleMatrixLocally(codim, fes_trial.LocGlobMap(),
                                  fes_test.LocGlobMap(), emp, coo_matrix);
  Eigen::Matrix<scalar_matrix_t, Eigen::Dynamic, Eigen::Dynamic> system_matrix =
      coo_matrix.makeDense();

  for (base::size_type i = 0; i < coeff_test.rows(); ++i) {
    coeff_test(i) = 1.;
    for (base::size_type j = 0; j < coeff_trial.rows(); ++j) {
      coeff_trial(j) = 1.;
      scalar_matrix_t result = evaluator(coeff_test, coeff_trial);
      auto entry = system_matrix(i, j);
      ASSERT_LT(std::abs(result - system_matrix(i, j)), 1e-7);
      coeff_trial(j) = 0.;
    }
    coeff_test(i) = 0;
  }
}